

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O1

void avro::codec_traits<uau::_union_array_union_Union__1__>::decode
               (Decoder *d,_union_array_union_Union__1__ *v)

{
  placeholder *ppVar1;
  ulong uVar2;
  undefined8 *puVar3;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_> vv
  ;
  undefined1 local_48 [40];
  
  uVar2 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Union index too big","");
    std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)local_48);
    *puVar3 = 0x1c87a0;
    puVar3[1] = 0x1c87d0;
    __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar2 & 1) == 0) {
    (**(code **)(*(long *)d + 0x18))(d);
    ppVar1 = (v->value_).content;
    v->idx_ = 0;
    (v->value_).content = (placeholder *)0x0;
    if (ppVar1 != (placeholder *)0x0) {
      (*ppVar1->_vptr_placeholder[1])();
      return;
    }
  }
  else {
    local_48._0_8_ = (pointer)0x0;
    local_48._8_8_ = (pointer)0x0;
    local_48._16_8_ = (pointer)0x0;
    codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
    ::decode(d,(vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
                *)local_48);
    v->idx_ = 1;
    boost::any::operator=
              (&v->value_,
               (vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
                *)local_48);
    std::
    vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ::~vector((vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
               *)local_48);
  }
  return;
}

Assistant:

static void decode(Decoder& d, uau::_union_array_union_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                std::vector<uau::_union_array_union_Union__0__ > vv;
                avro::decode(d, vv);
                v.set_array(vv);
            }
            break;
        }
    }